

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_index.cpp
# Opt level: O0

char * __thiscall
MeCab::FeatureIndex::getIndex(FeatureIndex *this,char **p,char **column,size_t max)

{
  int iVar1;
  ostream *poVar2;
  ulong in_RCX;
  long in_RDX;
  long *in_RSI;
  size_t n;
  bool flg;
  die local_49;
  ulong local_48;
  byte local_2b;
  die local_2a;
  byte local_29;
  ulong local_28;
  long local_20;
  long *local_18;
  char *local_8;
  
  *in_RSI = *in_RSI + 1;
  local_29 = *(char *)*in_RSI == '?';
  if ((bool)local_29) {
    *in_RSI = *in_RSI + 1;
  }
  local_2b = 0;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  if (*(char *)*in_RSI != '[') {
    die::die(&local_2a);
    local_2b = 1;
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                            );
    poVar2 = std::operator<<(poVar2,"(");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x2b);
    poVar2 = std::operator<<(poVar2,") [");
    poVar2 = std::operator<<(poVar2,"**p ==\'[\'");
    poVar2 = std::operator<<(poVar2,"] ");
    poVar2 = std::operator<<(poVar2,"getIndex(): unmatched \'[\'");
    die::operator&(&local_2a,poVar2);
  }
  if ((local_2b & 1) != 0) {
    die::~die((die *)0x16812a);
  }
  local_48 = 0;
  *local_18 = *local_18 + 1;
  do {
    if ((int)*(char *)*local_18 - 0x30U < 10) {
      local_48 = local_48 * 10 + (long)(*(char *)*local_18 + -0x30);
    }
    else {
      if (*(char *)*local_18 == 0x5d) {
        if (local_48 < local_28) {
          if (((local_29 & 1) == 1) &&
             ((iVar1 = strcmp("*",*(char **)(local_20 + local_48 * 8)), iVar1 == 0 ||
              (**(char **)(local_20 + local_48 * 8) == '\0')))) {
            local_8 = (char *)0x0;
          }
          else {
            local_8 = *(char **)(local_20 + local_48 * 8);
          }
        }
        else {
          local_8 = (char *)0x0;
        }
        return local_8;
      }
      die::die(&local_49);
      poVar2 = std::operator<<((ostream *)&std::cerr,
                               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                              );
      poVar2 = std::operator<<(poVar2,"(");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x42);
      poVar2 = std::operator<<(poVar2,") [");
      poVar2 = std::operator<<(poVar2,"false");
      poVar2 = std::operator<<(poVar2,"] ");
      poVar2 = std::operator<<(poVar2,"unmatched \'[\'");
      die::operator&(&local_49,poVar2);
      die::~die((die *)0x168343);
    }
    *local_18 = *local_18 + 1;
  } while( true );
}

Assistant:

const char* FeatureIndex::getIndex(char **p, char **column, size_t max) {
  ++(*p);

  bool flg = false;

  if (**p == '?') {
    flg = true;
    ++(*p);
  }  // undef flg

  CHECK_DIE(**p =='[') << "getIndex(): unmatched '['";

  size_t n = 0;
  ++(*p);

  for (;; ++(*p)) {
    switch (**p) {
      case '0': case '1': case '2': case '3': case '4':
      case '5': case '6': case '7': case '8': case '9':
        n = 10 * n + (**p - '0');
        break;
      case ']':
        if (n >= max) {
          return 0;
        }

        if (flg == true && ((std::strcmp("*", column[n]) == 0)
                            || column[n][0] == '\0')) {
          return 0;
        }
        return column[n];  // return;
        break;
      default:
        CHECK_DIE(false) << "unmatched '['";
    }
  }

  return 0;
}